

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileParser::~Q3BSPFileParser(Q3BSPFileParser *this)

{
  Q3BSPModel *this_00;
  pointer pcVar1;
  
  this_00 = this->m_pModel;
  if (this_00 != (Q3BSPModel *)0x0) {
    Q3BSP::Q3BSPModel::~Q3BSPModel(this_00);
  }
  operator_delete(this_00,0xe0);
  this->m_pModel = (Q3BSPModel *)0x0;
  pcVar1 = (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->m_Data).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
    return;
  }
  return;
}

Assistant:

Q3BSPFileParser::~Q3BSPFileParser() {
    delete m_pModel;
    m_pModel = nullptr;
}